

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void __thiscall
crnlib::vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::reserve
          (vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *this,uint new_capacity)

{
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint min_new_capacity;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> tmp;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> local_28;
  
  if (this->m_capacity < new_capacity) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this,new_capacity,false,0xc,object_mover,false);
    return;
  }
  if (new_capacity < this->m_capacity) {
    local_28.m_p = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)0x0;
    local_28.m_size = 0;
    local_28.m_capacity = 0;
    if (new_capacity < this->m_size) {
      new_capacity = this->m_size;
    }
    elemental_vector::increase_capacity
              ((elemental_vector *)&local_28,new_capacity,false,0xc,object_mover,false);
    if (&local_28 == this) {
      uVar3 = this->m_size;
      uVar2 = local_28.m_size;
    }
    else {
      min_new_capacity = this->m_size;
      if (local_28.m_capacity < min_new_capacity) {
        if (local_28.m_p != (pair<crnlib::vec<2U,_float>,_unsigned_int> *)0x0) {
          crnlib_free(local_28.m_p);
          local_28.m_p = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)0x0;
          local_28.m_size = 0;
          local_28.m_capacity = 0;
          min_new_capacity = this->m_size;
        }
        elemental_vector::increase_capacity
                  ((elemental_vector *)&local_28,min_new_capacity,false,0xc,object_mover,false);
        min_new_capacity = this->m_size;
      }
      else if (local_28.m_size != 0) {
        local_28._8_8_ = (ulong)local_28.m_capacity << 0x20;
      }
      if (min_new_capacity == 0) {
        uVar3 = 0;
        uVar2 = 0;
      }
      else {
        ppVar1 = this->m_p;
        lVar4 = 0;
        do {
          *(undefined4 *)((long)((local_28.m_p)->first).m_s + lVar4) =
               *(undefined4 *)((long)(ppVar1->first).m_s + lVar4);
          *(undefined4 *)((long)((local_28.m_p)->first).m_s + lVar4 + 4) =
               *(undefined4 *)((long)(ppVar1->first).m_s + lVar4 + 4);
          *(undefined4 *)((long)(&(local_28.m_p)->first + 1) + lVar4) =
               *(undefined4 *)((long)(&ppVar1->first + 1) + lVar4);
          lVar4 = lVar4 + 0xc;
          min_new_capacity = min_new_capacity - 1;
        } while (min_new_capacity != 0);
        uVar3 = this->m_size;
        uVar2 = uVar3;
      }
    }
    ppVar1 = this->m_p;
    this->m_p = local_28.m_p;
    this->m_size = uVar2;
    uVar2 = this->m_capacity;
    this->m_capacity = local_28.m_capacity;
    local_28.m_capacity = uVar2;
    local_28.m_size = uVar3;
    if (ppVar1 != (pair<crnlib::vec<2U,_float>,_unsigned_int> *)0x0) {
      local_28.m_p = ppVar1;
      crnlib_free(ppVar1);
    }
  }
  return;
}

Assistant:

inline void reserve(uint new_capacity) {
    if (new_capacity > m_capacity)
      increase_capacity(new_capacity, false);
    else if (new_capacity < m_capacity) {
      // Must work around the lack of a "decrease_capacity()" method.
      // This case is rare enough in practice that it's probably not worth implementing an optimized in-place resize.
      vector tmp;
      tmp.increase_capacity(math::maximum(m_size, new_capacity), false);
      tmp = *this;
      swap(tmp);
    }
  }